

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O2

void __thiscall
Assimp::AssbinImporter::ReadBinaryMaterialProperty
          (AssbinImporter *this,IOStream *stream,aiMaterialProperty *prop)

{
  uint uVar1;
  aiPropertyTypeInfo aVar2;
  char *pcVar3;
  DeadlyImportError *this_00;
  allocator<char> local_429;
  string local_428 [32];
  
  uVar1 = Read<unsigned_int>(stream);
  if (uVar1 == 0x123e) {
    Read<unsigned_int>(stream);
    Read<aiString>((aiString *)local_428,stream);
    if ((aiMaterialProperty *)local_428 != prop) {
      (prop->mKey).length = (uint)local_428[0]._M_dataplus._M_p;
      memcpy((prop->mKey).data,(void *)((long)&local_428[0]._M_dataplus._M_p + 4),
             (ulong)(uint)local_428[0]._M_dataplus._M_p);
      (prop->mKey).data[(uint)local_428[0]._M_dataplus._M_p] = '\0';
    }
    uVar1 = Read<unsigned_int>(stream);
    prop->mSemantic = uVar1;
    uVar1 = Read<unsigned_int>(stream);
    prop->mIndex = uVar1;
    uVar1 = Read<unsigned_int>(stream);
    prop->mDataLength = uVar1;
    aVar2 = Read<unsigned_int>(stream);
    prop->mType = aVar2;
    uVar1 = prop->mDataLength;
    pcVar3 = (char *)operator_new__((ulong)uVar1);
    prop->mData = pcVar3;
    (*stream->_vptr_IOStream[2])(stream,pcVar3,1,(ulong)uVar1);
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_428,"Magic chunk identifiers are wrong!",&local_429);
  DeadlyImportError::DeadlyImportError(this_00,local_428);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AssbinImporter::ReadBinaryMaterialProperty(IOStream * stream, aiMaterialProperty* prop) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AIMATERIALPROPERTY)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    prop->mKey = Read<aiString>(stream);
    prop->mSemantic = Read<unsigned int>(stream);
    prop->mIndex = Read<unsigned int>(stream);

    prop->mDataLength = Read<unsigned int>(stream);
    prop->mType = (aiPropertyTypeInfo)Read<unsigned int>(stream);
    prop->mData = new char [ prop->mDataLength ];
    stream->Read(prop->mData,1,prop->mDataLength);
}